

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O2

void new_localvar(LexState *ls,TString *name,int n)

{
  FuncState *fs;
  GCObject *o;
  GCObject *pGVar1;
  unsigned_short uVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  FuncState *pFVar6;
  
  fs = ls->fs;
  pFVar6 = fs;
  if (199 < (int)((uint)fs->nactvar + n)) {
    errorlimit(fs,200,"local variables");
    pFVar6 = ls->fs;
  }
  o = (GCObject *)pFVar6->f;
  iVar3 = (o->p).sizelocvars;
  lVar5 = (long)iVar3;
  if (pFVar6->nlocvars < iVar3) {
    pGVar1 = (o->h).gclist;
  }
  else {
    pGVar1 = (GCObject *)
             luaM_growaux_(ls->L,(o->h).gclist,&(o->p).sizelocvars,0x10,0x7fff,
                           "too many local variables");
    (o->h).gclist = pGVar1;
    iVar3 = (o->p).sizelocvars;
  }
  puVar4 = (undefined8 *)(lVar5 * 0x10 + (long)pGVar1);
  for (; lVar5 < iVar3; lVar5 = lVar5 + 1) {
    *puVar4 = 0;
    puVar4 = puVar4 + 2;
  }
  uVar2 = pFVar6->nlocvars;
  *(TString **)((long)pGVar1 + (long)(short)uVar2 * 0x10) = name;
  if ((((name->tsv).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
    luaC_barrierf(ls->L,o,(GCObject *)name);
    uVar2 = pFVar6->nlocvars;
  }
  pFVar6->nlocvars = uVar2 + 1;
  fs->actvar[(long)n + (ulong)fs->nactvar] = uVar2;
  return;
}

Assistant:

static void new_localvar (LexState *ls, TString *name, int n) {
  FuncState *fs = ls->fs;
  luaY_checklimit(fs, fs->nactvar+n+1, LUAI_MAXVARS, "local variables");
  fs->actvar[fs->nactvar+n] = cast(unsigned short, registerlocalvar(ls, name));
}